

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_reader.c
# Opt level: O1

int rfc5444_reader_handle_packet(rfc5444_reader *parser,uint8_t *buffer,size_t length)

{
  uint32_t *puVar1;
  avl_node *paVar2;
  uint32_t uVar3;
  rfc5444_reader_addrblock_entry *prVar4;
  rfc5444_reader_tlvblock_entry *prVar5;
  rfc5444_reader_tlvblock_entry *prVar6;
  rfc5444_reader_tlvblock_entry *prVar7;
  rfc5444_reader_tlvblock_entry *prVar8;
  list_entity *plVar9;
  avl_node *paVar10;
  undefined8 uVar11;
  rfc5444_reader *prVar12;
  avl_tree *paVar13;
  byte bVar14;
  uint8_t uVar15;
  ushort uVar16;
  rfc5444_result rVar17;
  rfc5444_result rVar18;
  uint uVar19;
  rfc5444_reader_addrblock_entry *prVar20;
  rfc5444_reader_tlvblock_consumer *prVar21;
  rfc5444_reader_tlvblock_consumer *prVar22;
  uint8_t uVar23;
  uint8_t *puVar24;
  ulong __n;
  rfc5444_reader_tlvblock_consumer *prVar25;
  byte bVar26;
  ulong uVar27;
  long *plVar28;
  rfc5444_reader_tlvblock_consumer *prVar29;
  ulong uVar30;
  ulong uVar31;
  rfc5444_reader_addrblock_entry *prVar32;
  bool bVar33;
  uint8_t *ptr;
  rfc5444_reader_tlvblock_context context;
  avl_tree entries;
  avl_tree tlv_entries;
  avl_node *local_198;
  rfc5444_reader_tlvblock_consumer *local_190;
  avl_node *local_188;
  rfc5444_reader_tlvblock_consumer *local_180;
  avl_node *local_178;
  rfc5444_result local_16c;
  rfc5444_reader_tlvblock_consumer *local_168;
  undefined1 local_160 [56];
  rfc5444_reader_tlvblock_context local_128;
  avl_tree *local_90;
  uint8_t *local_88;
  avl_tree local_80;
  rfc5444_reader_tlvblock_entry *local_58;
  rfc5444_reader_tlvblock_entry *local_50;
  avl_node *local_48;
  uint32_t local_40;
  
  if (0xffff < length) {
    return -0x10;
  }
  rVar17 = RFC5444_OKAY;
  local_198 = (avl_node *)buffer;
  memset(&local_128,0,0x98);
  if (length == 0) {
    rVar17 = RFC5444_END_OF_BUFFER;
    uVar30 = 0;
  }
  else {
    uVar30 = (ulong)*buffer;
    local_198 = (avl_node *)(buffer + 1);
  }
  local_128.pkt_version = (uint8_t)(uVar30 >> 4);
  bVar14 = (byte)uVar30;
  local_128.pkt_flags = bVar14 & 0xf;
  if (0xf < bVar14) {
    return -1;
  }
  local_178 = (avl_node *)(buffer + length);
  local_128.has_pktseqno = (_Bool)(bVar14 >> 3);
  if (bVar14 < 8) goto LAB_0015208e;
  if (length == 0) {
LAB_0015205d:
    uVar16 = 0;
  }
  else {
    if (local_178 <= local_198) {
      rVar17 = RFC5444_END_OF_BUFFER;
      goto LAB_0015205d;
    }
    plVar9 = &local_198->list;
    local_198 = (avl_node *)((long)&(local_198->list).next + 1);
    uVar16 = (ushort)*(byte *)&plVar9->next << 8;
  }
  if (rVar17 == RFC5444_OKAY) {
    if (local_178 <= local_198) {
      rVar17 = RFC5444_END_OF_BUFFER;
      goto LAB_0015207f;
    }
    local_128.pkt_seqno = (uint16_t)*(byte *)&(local_198->list).next;
    local_198 = (avl_node *)((long)&(local_198->list).next + 1);
  }
  else {
LAB_0015207f:
    local_128.pkt_seqno = 0;
  }
  local_128.pkt_seqno = local_128.pkt_seqno | uVar16;
LAB_0015208e:
  rVar18 = rVar17;
  if ((rVar17 == RFC5444_OKAY) &&
     ((local_128.reader = parser, avl_init(&local_80,avl_comp_uint32,true),
      uVar15 = local_128.pkt_flags, (local_128.pkt_flags & 4) == 0 ||
      (rVar17 = _parse_tlvblock(parser,&local_80,(uint8_t **)&local_198,(uint8_t *)local_178,'\0'),
      rVar18 = rVar17, rVar17 == RFC5444_OKAY)))) {
    prVar22 = (rfc5444_reader_tlvblock_consumer *)(parser->packet_consumer).list_head.next;
    local_128.pkt_buffer = buffer;
    local_128.pkt_size = length;
    if ((prVar22->_node).list.prev == (parser->packet_consumer).list_head.prev) {
      prVar25 = (rfc5444_reader_tlvblock_consumer *)0x0;
    }
    else {
      do {
        prVar25 = prVar22;
        if (((prVar25->start_callback !=
              (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr *)0x0) &&
            (local_128.consumer = prVar25, rVar17 = (*prVar25->start_callback)(&local_128),
            rVar17 != RFC5444_OKAY)) ||
           (((uVar15 & 4) != 0 &&
            (((prVar25->tlv_callback !=
               (_func_rfc5444_result_rfc5444_reader_tlvblock_entry_ptr_rfc5444_reader_tlvblock_context_ptr
                *)0x0 ||
              (prVar25->block_callback !=
               (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr *)0x0)) &&
             (rVar17 = _schedule_tlvblock(prVar25,&local_128,&local_80,'\0'), rVar17 != RFC5444_OKAY
             )))))) goto LAB_00152bde;
        prVar22 = (rfc5444_reader_tlvblock_consumer *)(prVar25->_node).list.next;
      } while ((prVar22->_node).list.prev != (parser->packet_consumer).list_head.prev);
    }
    prVar12 = parser;
    if (local_198 < local_178 && rVar17 == RFC5444_OKAY) {
      do {
        local_160._48_8_ = prVar25;
        local_160._16_8_ = prVar12;
        paVar2 = local_198;
        avl_init((avl_tree *)&stack0xffffffffffffffa8,avl_comp_uint16,true);
        local_160._0_8_ = local_160;
        local_128._do_not_forward = false;
        local_128.msg_type = *(uint8_t *)&(paVar2->list).next;
        local_198 = (avl_node *)((long)&(paVar2->list).next + 1);
        rVar18 = RFC5444_OKAY;
        if (local_198 < local_178) {
          uVar19 = (uint)*(byte *)((long)&(paVar2->list).next + 1);
          local_198 = (avl_node *)((long)&(paVar2->list).next + 2);
          if (local_178 <= local_198) goto LAB_00152250;
          plVar9 = &local_198->list;
          local_198 = (avl_node *)((long)&(paVar2->list).next + 3);
          uVar30 = (ulong)*(byte *)&plVar9->next << 8;
        }
        else {
          uVar19 = 0;
LAB_00152250:
          rVar18 = RFC5444_END_OF_BUFFER;
          uVar30 = 0;
        }
        if (rVar18 == RFC5444_OKAY) {
          if (local_178 <= local_198) {
            rVar18 = RFC5444_END_OF_BUFFER;
            goto LAB_00152274;
          }
          uVar27 = (ulong)*(byte *)&(local_198->list).next;
          local_198 = (avl_node *)((long)&(local_198->list).next + 1);
        }
        else {
LAB_00152274:
          uVar27 = 0;
        }
        paVar10 = local_198;
        bVar14 = (byte)uVar19;
        local_128.addr_len = (bVar14 & 0xf) + 1;
        local_128.msg_flags = bVar14 & 0xf0;
        local_128.has_origaddr = (_Bool)(bVar14 >> 7);
        local_160._8_8_ = local_160._0_8_;
        local_160._24_8_ = paVar2;
        if ((char)bVar14 < '\0') {
          if ((avl_node *)((long)&(local_198->list).next + (ulong)local_128.addr_len) <= local_178)
          {
            netaddr_from_binary_prefix
                      (&local_128.orig_addr,local_198,(ulong)local_128.addr_len,'\0',0xff);
            local_198 = (avl_node *)((long)&(paVar10->list).next + (ulong)local_128.addr_len);
            goto LAB_001522f6;
          }
          rVar18 = RFC5444_END_OF_BUFFER;
          local_188 = (avl_node *)0x0;
        }
        else {
LAB_001522f6:
          local_128.has_hoplimit = SUB41((uVar19 & 0x40) >> 6,0);
          if ((uVar19 & 0x40) != 0) {
            if (rVar18 == RFC5444_OKAY) {
              if (local_198 < local_178) {
                local_128.hoplimit = *(uint8_t *)&(local_198->list).next;
                local_198 = (avl_node *)((long)&(local_198->list).next + 1);
                goto LAB_00152336;
              }
              rVar18 = RFC5444_END_OF_BUFFER;
            }
            local_128.hoplimit = 0;
          }
LAB_00152336:
          local_128.has_hopcount = SUB41((uVar19 & 0x20) >> 5,0);
          if ((uVar19 & 0x20) != 0) {
            if (rVar18 == RFC5444_OKAY) {
              if (local_198 < local_178) {
                local_128.hopcount = *(uint8_t *)&(local_198->list).next;
                local_198 = (avl_node *)((long)&(local_198->list).next + 1);
                goto LAB_00152373;
              }
              rVar18 = RFC5444_END_OF_BUFFER;
            }
            local_128.hopcount = '\0';
          }
LAB_00152373:
          local_128.has_seqno = SUB41((uVar19 & 0x10) >> 4,0);
          if ((uVar19 & 0x10) != 0) {
            if (rVar18 == RFC5444_OKAY) {
              if (local_178 <= local_198) {
                rVar18 = RFC5444_END_OF_BUFFER;
                goto LAB_001523a9;
              }
              plVar9 = &local_198->list;
              local_198 = (avl_node *)((long)&(local_198->list).next + 1);
              uVar16 = (ushort)*(byte *)&plVar9->next << 8;
            }
            else {
LAB_001523a9:
              uVar16 = 0;
            }
            if (rVar18 == RFC5444_OKAY) {
              if (local_178 <= local_198) {
                rVar18 = RFC5444_END_OF_BUFFER;
                goto LAB_001523cb;
              }
              local_128.seqno = (uint16_t)*(byte *)&(local_198->list).next;
              local_198 = (avl_node *)((long)&(local_198->list).next + 1);
            }
            else {
LAB_001523cb:
              local_128.seqno = 0;
            }
            local_128.seqno = local_128.seqno | uVar16;
          }
          paVar2 = (avl_node *)((long)&((list_entity *)local_160._24_8_)->next + (uVar27 | uVar30));
          if (local_178 < paVar2) {
            local_198 = local_178;
            rVar18 = RFC5444_END_OF_BUFFER;
          }
          local_188 = paVar2;
          if ((rVar18 == RFC5444_OKAY) &&
             (rVar18 = _parse_tlvblock(parser,(avl_tree *)&stack0xffffffffffffffa8,
                                       (uint8_t **)&local_198,(uint8_t *)paVar2,'\0'),
             rVar18 == RFC5444_OKAY)) {
            if (local_198 < paVar2) {
              do {
                prVar20 = (*parser->malloc_addrblock_entry)();
                if (prVar20 == (rfc5444_reader_addrblock_entry *)0x0) {
                  rVar18 = RFC5444_OUT_OF_MEMORY;
                  goto LAB_00152423;
                }
                paVar13 = &prVar20->tlvblock;
                avl_init(paVar13,avl_comp_uint16,true);
                uVar15 = local_128.addr_len;
                paVar2 = local_198;
                prVar20->addr_block_ptr = (uint8_t *)local_198;
                rVar17 = RFC5444_OKAY;
                if (local_198 < local_188) {
                  uVar23 = *(uint8_t *)&(local_198->list).next;
                  local_198 = (avl_node *)((long)&(local_198->list).next + 1);
                }
                else {
                  rVar17 = RFC5444_END_OF_BUFFER;
                  uVar23 = '\0';
                }
                prVar20->num_addr = uVar23;
                local_190 = (rfc5444_reader_tlvblock_consumer *)paVar13;
                if (uVar23 == '\0') {
                  rVar18 = RFC5444_EMPTY_ADDRBLOCK;
                  goto LAB_001527f7;
                }
                if (paVar2 < local_188) {
                  if (local_188 <= local_198) {
                    rVar17 = RFC5444_END_OF_BUFFER;
                    goto LAB_001525ed;
                  }
                  bVar14 = *(byte *)&(local_198->list).next;
                  local_198 = (avl_node *)((long)&(local_198->list).next + 1);
                }
                else {
LAB_001525ed:
                  bVar14 = 0;
                }
                prVar20->addr[0] = '\0';
                prVar20->addr[1] = '\0';
                prVar20->addr[2] = '\0';
                prVar20->addr[3] = '\0';
                prVar20->addr[4] = '\0';
                prVar20->addr[5] = '\0';
                prVar20->addr[6] = '\0';
                prVar20->addr[7] = '\0';
                prVar20->addr[8] = '\0';
                prVar20->addr[9] = '\0';
                prVar20->addr[10] = '\0';
                prVar20->addr[0xb] = '\0';
                prVar20->addr[0xc] = '\0';
                prVar20->addr[0xd] = '\0';
                prVar20->addr[0xe] = '\0';
                prVar20->addr[0xf] = '\0';
                uVar31 = (ulong)local_128.addr_len;
                prVar20->mid_len = local_128.addr_len;
                if ((char)bVar14 < '\0') {
                  if (rVar17 == RFC5444_OKAY) {
                    if (local_188 <= local_198) {
                      rVar17 = RFC5444_END_OF_BUFFER;
                      goto LAB_00152698;
                    }
                    bVar26 = *(byte *)&(local_198->list).next;
                    local_198 = (avl_node *)((long)&(local_198->list).next + 1);
                  }
                  else {
LAB_00152698:
                    bVar26 = 0;
                  }
                  prVar20->mid_start = bVar26;
                  rVar18 = RFC5444_BAD_ADDR_HEAD_LENGTH;
                  if (((byte)(bVar26 - 1) < 0xf) && (bVar26 < local_128.addr_len)) {
                    paVar2 = (avl_node *)((long)&(local_198->list).next + (ulong)bVar26);
                    rVar18 = RFC5444_END_OF_BUFFER;
                    if (paVar2 <= local_188) {
                      local_16c = rVar17;
                      local_160._32_8_ = paVar2;
                      memcpy(prVar20->addr,local_198,(ulong)bVar26);
                      prVar20->mid_len = uVar15 - bVar26;
                      local_198 = (avl_node *)local_160._32_8_;
                      rVar17 = local_16c;
                      goto LAB_0015260d;
                    }
                  }
                  goto LAB_001527f7;
                }
LAB_0015260d:
                switch(bVar14 >> 5 & 3) {
                case 0:
                  goto switchD_00152625_caseD_0;
                case 1:
                  if (rVar17 == RFC5444_OKAY) {
                    if (local_188 <= local_198) {
                      rVar17 = RFC5444_END_OF_BUFFER;
                      goto LAB_00152763;
                    }
                    uVar15 = *(uint8_t *)&(local_198->list).next;
                    local_198 = (avl_node *)((long)&(local_198->list).next + 1);
                  }
                  else {
LAB_00152763:
                    uVar15 = '\0';
                  }
                  prVar20->mid_len = prVar20->mid_len - uVar15;
switchD_00152625_caseD_0:
                  prVar20->mid_src = (uint8_t *)local_198;
                  local_198 = (avl_node *)
                              ((long)&(local_198->list).next +
                              (ulong)prVar20->mid_len * (ulong)prVar20->num_addr);
                  rVar18 = RFC5444_END_OF_BUFFER;
                  if (local_198 <= local_188) {
                    switch(bVar14 >> 3 & 3) {
                    case 0:
                      prVar20->prefixlen = local_128.addr_len << 3;
                      break;
                    case 1:
                      prVar20->prefixes = (uint8_t *)local_198;
                      local_198 = (avl_node *)
                                  ((long)&(local_198->list).next + (ulong)prVar20->num_addr);
                      break;
                    case 2:
                      prVar20->prefixlen = *(uint8_t *)&(local_198->list).next;
                      local_198 = (avl_node *)((long)&(local_198->list).next + 1);
                      break;
                    case 3:
                      rVar18 = RFC5444_BAD_MSG_PREFIXFLAGS;
                      goto LAB_001527f7;
                    }
                    if (local_198 <= local_188) {
                      prVar20->addr_block_size = (long)local_198 - (long)prVar20->addr_block_ptr;
                      rVar18 = rVar17;
                    }
                  }
                  break;
                case 2:
                  if (rVar17 == RFC5444_OKAY) {
                    if (local_188 <= local_198) {
                      rVar17 = RFC5444_END_OF_BUFFER;
                      goto LAB_00152705;
                    }
                    bVar26 = *(byte *)&(local_198->list).next;
                    local_198 = (avl_node *)((long)&(local_198->list).next + 1);
                  }
                  else {
LAB_00152705:
                    bVar26 = 0;
                  }
                  rVar18 = RFC5444_BAD_ADDR_TAIL_LENGTH;
                  if (((byte)(bVar26 - 1) < 0xf) && (bVar26 < uVar15)) {
                    __n = (ulong)bVar26;
                    paVar2 = (avl_node *)((long)&(local_198->list).next + __n);
                    rVar18 = RFC5444_END_OF_BUFFER;
                    if (paVar2 <= local_188) {
                      memcpy(prVar20->addr + (uVar31 - __n),local_198,__n);
                      prVar20->mid_len = prVar20->mid_len - bVar26;
                      local_198 = paVar2;
                      goto switchD_00152625_caseD_0;
                    }
                  }
                  break;
                case 3:
                  rVar18 = RFC5444_BAD_MSG_TAILFLAGS;
                }
LAB_001527f7:
                parser = (rfc5444_reader *)local_160._16_8_;
                paVar2 = local_188;
                if ((rVar18 != RFC5444_OKAY) ||
                   (rVar18 = _parse_tlvblock((rfc5444_reader *)local_160._16_8_,
                                             (avl_tree *)local_190,(uint8_t **)&local_198,
                                             (uint8_t *)local_188,prVar20->num_addr),
                   uVar11 = local_160._8_8_, rVar18 != RFC5444_OKAY)) {
                  (**(_func_void_rfc5444_reader_addrblock_entry_ptr **)((long)parser + 0x70))
                            (prVar20);
                  goto LAB_00152423;
                }
                prVar20->addr_tlv_size =
                     (size_t)((long)local_198 +
                             (-(long)prVar20->addr_block_ptr - prVar20->addr_block_size));
                (prVar20->list_node).next = (list_entity *)local_160;
                (prVar20->list_node).prev = (list_entity *)local_160._8_8_;
                local_160._8_8_ = prVar20;
                ((list_entity *)uVar11)->next = &prVar20->list_node;
              } while (local_198 < paVar2);
            }
            prVar22 = (rfc5444_reader_tlvblock_consumer *)(ulong)(uint)rVar18;
            local_128.msg_buffer = (uint8_t *)local_160._24_8_;
            local_128.msg_size = uVar27 | uVar30;
            local_190 = (rfc5444_reader_tlvblock_consumer *)
                        (parser->message_consumer).list_head.next;
            if ((local_190->_node).list.prev == (parser->message_consumer).list_head.prev) {
              local_180 = (rfc5444_reader_tlvblock_consumer *)0x0;
              prVar25 = (rfc5444_reader_tlvblock_consumer *)0x0;
            }
            else {
              prVar25 = (rfc5444_reader_tlvblock_consumer *)0x0;
              local_180 = (rfc5444_reader_tlvblock_consumer *)0x0;
              do {
                local_168 = prVar25;
                if ((local_190->default_msg_consumer != false) ||
                   (local_190->msg_id == local_128.msg_type)) {
                  if (local_180 == (rfc5444_reader_tlvblock_consumer *)0x0) {
LAB_001528fc:
                    local_180 = (rfc5444_reader_tlvblock_consumer *)0x0;
                  }
                  else if (prVar25->order < local_190->order) {
                    rVar18 = schedule_end_message_cbs
                                       (&local_128,local_180,prVar25,(rfc5444_result)prVar22);
                    if (rVar18 == RFC5444_OKAY) goto LAB_001528fc;
                    goto LAB_00152423;
                  }
                  if (local_190->addrblock_consumer == true) {
                    local_128.type = RFC5444_CONTEXT_ADDRESS;
                    prVar29 = (rfc5444_reader_tlvblock_consumer *)0x0;
                    plVar28 = (long *)local_160;
                    prVar21 = local_190;
                    do {
                      prVar22 = (rfc5444_reader_tlvblock_consumer *)((ulong)prVar21 & 0xffffffff);
                      plVar28 = (long *)*plVar28;
                      if ((rfc5444_reader_addrblock_entry *)plVar28[1] ==
                          (rfc5444_reader_addrblock_entry *)local_160._8_8_) {
                        local_128.addr_block_buffer = (uint8_t *)0x0;
                        prVar25 = local_168;
                        parser = (rfc5444_reader *)local_160._16_8_;
                        prVar22 = prVar29;
                        break;
                      }
                      local_128.addr_block_buffer = (uint8_t *)plVar28[0xd];
                      local_128.addr_block_size = plVar28[0xe];
                      local_128.addr_tlv_size = plVar28[0xf];
                      bVar33 = *(char *)(plVar28 + 7) != '\0';
                      if (bVar33) {
                        local_160._44_4_ = (uint)prVar21;
                        local_160._32_8_ = (avl_node *)(plVar28 + 10);
                        local_88 = (uint8_t *)(plVar28 + 0xc);
                        local_90 = (avl_tree *)(plVar28 + 2);
                        bVar33 = true;
                        uVar30 = 0;
                        do {
                          uVar11 = local_160._32_8_;
                          uVar27 = (ulong)((uint)(uVar30 >> 6) & 3);
                          bVar14 = (byte)uVar30;
                          if (((ulong)plVar28[uVar27 + 0x10] >> (uVar30 & 0x3f) & 1) == 0) {
                            local_16c = (rfc5444_result)prVar29;
                            memcpy((uint8_t *)
                                   ((long)&((list_entity *)local_160._32_8_)->next +
                                   (ulong)*(byte *)((long)plVar28 + 0x39)),
                                   (void *)(uVar30 * *(byte *)((long)plVar28 + 0x3a) + plVar28[9]),
                                   (ulong)*(byte *)((long)plVar28 + 0x3a));
                            puVar24 = (uint8_t *)(plVar28[8] + uVar30);
                            if (plVar28[8] == 0) {
                              puVar24 = local_88;
                            }
                            netaddr_from_binary_prefix
                                      (&local_128.addr,(void *)uVar11,(ulong)local_128.addr_len,'\0'
                                       ,*puVar24);
                            local_128.addr_index = bVar14;
                            rVar17 = local_16c;
                            if (local_190->start_callback !=
                                (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr *)0x0) {
                              local_128.consumer = local_190;
                              rVar17 = (*local_190->start_callback)(&local_128);
                            }
                            if (rVar17 == RFC5444_OKAY) {
                              rVar17 = _schedule_tlvblock(local_190,&local_128,local_90,bVar14);
                            }
                            prVar22 = (rfc5444_reader_tlvblock_consumer *)(ulong)(uint)rVar17;
                            if (local_190->end_callback !=
                                (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr__Bool *)
                                0x0) {
                              local_128.consumer = local_190;
                              rVar18 = (*local_190->end_callback)(&local_128,rVar17 != RFC5444_OKAY)
                              ;
                              if (rVar17 < rVar18) {
                                prVar22 = (rfc5444_reader_tlvblock_consumer *)(ulong)(uint)rVar18;
                              }
                            }
                            prVar29 = prVar22;
                            if ((int)prVar22 != 0) {
                              if ((int)prVar22 != 2) goto LAB_00152ad3;
                              plVar28[uVar27 + 0x10] =
                                   plVar28[uVar27 + 0x10] | 1L << (bVar14 & 0x3f);
                              prVar29 = (rfc5444_reader_tlvblock_consumer *)0x0;
                            }
                          }
                          uVar30 = uVar30 + 1;
                          bVar33 = uVar30 < *(byte *)(plVar28 + 7);
                        } while (bVar33);
                        prVar22 = (rfc5444_reader_tlvblock_consumer *)(ulong)(uint)local_160._44_4_;
                      }
LAB_00152ad3:
                      prVar21 = prVar22;
                      prVar25 = local_168;
                      parser = (rfc5444_reader *)local_160._16_8_;
                    } while (!bVar33);
                  }
                  else {
                    local_128.type = RFC5444_CONTEXT_MESSAGE;
                    if (local_190->start_callback ==
                        (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr *)0x0) {
                      prVar22 = (rfc5444_reader_tlvblock_consumer *)0x0;
                    }
                    else {
                      local_128.consumer = local_190;
                      rVar17 = (*local_190->start_callback)(&local_128);
                      prVar22 = (rfc5444_reader_tlvblock_consumer *)(ulong)(uint)rVar17;
                    }
                    if ((int)prVar22 == 0) {
                      uVar19 = _schedule_tlvblock(local_190,&local_128,
                                                  (avl_tree *)&stack0xffffffffffffffa8,'\0');
                      prVar22 = (rfc5444_reader_tlvblock_consumer *)(ulong)uVar19;
                    }
                    prVar25 = local_190;
                    if (local_180 == (rfc5444_reader_tlvblock_consumer *)0x0) {
                      local_180 = local_190;
                    }
                  }
                  rVar18 = (rfc5444_result)prVar22;
                  if (rVar18 != RFC5444_OKAY) break;
                }
                rVar18 = (rfc5444_result)prVar22;
                local_190 = (rfc5444_reader_tlvblock_consumer *)(local_190->_node).list.next;
              } while ((local_190->_node).list.prev != (parser->message_consumer).list_head.prev);
            }
            if (local_180 != (rfc5444_reader_tlvblock_consumer *)0x0) {
              rVar18 = schedule_end_message_cbs(&local_128,local_180,prVar25,rVar18);
            }
          }
        }
LAB_00152423:
        local_128.msg_buffer = (uint8_t *)0x0;
        if (((((rVar18 == RFC5444_DROP_MSG_BUT_FORWARD) || (rVar18 == RFC5444_OKAY)) &&
             (local_128._do_not_forward == false)) &&
            ((parser->forward_message !=
              (_func_void_rfc5444_reader_tlvblock_context_ptr_uint8_t_ptr_size_t *)0x0 &&
             (local_128.has_hoplimit == true)))) && (1 < local_128.hoplimit)) {
          local_128.type = RFC5444_CONTEXT_MESSAGE;
          (*parser->forward_message)
                    (&local_128,(uint8_t *)local_160._24_8_,(long)local_188 - local_160._24_8_);
        }
        prVar20 = (rfc5444_reader_addrblock_entry *)((list_entity *)local_160._0_8_)->prev;
        prVar32 = (rfc5444_reader_addrblock_entry *)local_160._0_8_;
        while (prVar20 != (rfc5444_reader_addrblock_entry *)local_160._8_8_) {
          prVar4 = (rfc5444_reader_addrblock_entry *)(prVar32->list_node).next;
          prVar5 = (rfc5444_reader_tlvblock_entry *)(prVar32->tlvblock).list_head.next;
          prVar6 = (rfc5444_reader_tlvblock_entry *)(prVar5->node).list.next;
          (prVar32->tlvblock).list_head.prev = &(prVar32->tlvblock).list_head;
          (prVar32->tlvblock).list_head.next = &(prVar32->tlvblock).list_head;
          (prVar32->tlvblock).root = (avl_node *)0x0;
          uVar3 = (prVar32->tlvblock).count;
          while (uVar3 != 0) {
            (*parser->free_tlvblock_entry)(prVar5);
            prVar7 = (rfc5444_reader_tlvblock_entry *)(prVar6->node).list.next;
            puVar1 = &(prVar32->tlvblock).count;
            *puVar1 = *puVar1 - 1;
            prVar5 = prVar6;
            prVar6 = prVar7;
            uVar3 = *puVar1;
          }
          (*parser->free_addrblock_entry)(prVar32);
          prVar32 = prVar4;
          prVar20 = (rfc5444_reader_addrblock_entry *)(prVar4->list_node).prev;
        }
        local_50 = (rfc5444_reader_tlvblock_entry *)&stack0xffffffffffffffa8;
        local_48 = (avl_node *)0x0;
        prVar6 = (rfc5444_reader_tlvblock_entry *)(local_58->node).list.next;
        prVar7 = local_50;
        prVar25 = (rfc5444_reader_tlvblock_consumer *)local_160._48_8_;
        prVar5 = local_58;
        for (; local_58 = prVar7, prVar8 = prVar6, local_160._48_8_ = prVar25, local_40 != 0;
            local_40 = local_40 - 1) {
          (*parser->free_tlvblock_entry)(prVar5);
          prVar6 = (rfc5444_reader_tlvblock_entry *)(prVar8->node).list.next;
          prVar7 = local_58;
          prVar25 = (rfc5444_reader_tlvblock_consumer *)local_160._48_8_;
          prVar5 = prVar8;
        }
        rVar17 = rVar18 >> 0x1f & rVar18;
        if (rVar18 == RFC5444_DROP_PACKET) {
          rVar17 = RFC5444_DROP_PACKET;
        }
      } while ((rVar17 == RFC5444_OKAY) &&
              (local_198 = local_188, prVar12 = (rfc5444_reader *)local_160._16_8_,
              local_188 < local_178));
      local_40 = 0;
      local_198 = local_188;
    }
LAB_00152bde:
    if (((parser->packet_consumer).count != 0) &&
       ((prVar25->_node).list.next != (parser->packet_consumer).list_head.next)) {
      do {
        if (prVar25->end_callback !=
            (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr__Bool *)0x0) {
          local_128.consumer = prVar25;
          (*prVar25->end_callback)(&local_128,rVar17 != RFC5444_OKAY);
        }
        prVar25 = (rfc5444_reader_tlvblock_consumer *)(prVar25->_node).list.prev;
      } while ((prVar25->_node).list.next != (parser->packet_consumer).list_head.next);
    }
    local_80.list_head.prev = &local_80.list_head;
    local_80.root = (avl_node *)0x0;
    prVar6 = (rfc5444_reader_tlvblock_entry *)
             (((avl_node *)&(local_80.list_head.next)->next)->list).next;
    paVar13 = (avl_tree *)local_80.list_head.prev;
    prVar5 = (rfc5444_reader_tlvblock_entry *)local_80.list_head.next;
    for (; local_80.list_head.next = &paVar13->list_head, prVar7 = prVar6, local_80.count != 0;
        local_80.count = local_80.count - 1) {
      (*parser->free_tlvblock_entry)(prVar5);
      prVar6 = (rfc5444_reader_tlvblock_entry *)(prVar7->node).list.next;
      paVar13 = (avl_tree *)local_80.list_head.next;
      prVar5 = prVar7;
    }
    rVar18 = RFC5444_OKAY;
    if (rVar17 != RFC5444_DROP_PACKET) {
      rVar18 = rVar17;
    }
  }
  return rVar18;
}

Assistant:

enum rfc5444_result
rfc5444_reader_handle_packet(struct rfc5444_reader *parser, const uint8_t *buffer, size_t length)
{
  struct rfc5444_reader_tlvblock_context context;
  struct avl_tree entries;
  struct rfc5444_reader_tlvblock_consumer *consumer, *last_started;
  const uint8_t *ptr, *eob;
  bool has_tlv;
  uint8_t first_byte;
  enum rfc5444_result result = RFC5444_OKAY;

  if (length > 65535) {
    return RFC5444_TOO_LARGE;
  }

  /* copy pointer to prevent writing over parameter */
  ptr = buffer;
  eob = buffer + length;

  /* initialize tlv context */
  memset(&context, 0, sizeof(context));
  context.type = RFC5444_CONTEXT_PACKET;
  context.reader = parser;

  /* read header of packet */
  first_byte = _rfc5444_get_u8(&ptr, eob, &result);
  context.pkt_version = rfc5444_get_pktversion(first_byte);
  context.pkt_flags = first_byte & RFC5444_PKT_FLAGMASK;

  if (context.pkt_version != 0) {
    /*
     * bad packet version, do not jump to cleanup_parse packet because
     * we have not allocated any resources at this point
     */
    return RFC5444_UNSUPPORTED_VERSION;
  }

  /* check for sequence number */
  context.has_pktseqno = ((context.pkt_flags & RFC5444_PKT_FLAG_SEQNO) != 0);
  if (context.has_pktseqno) {
    context.pkt_seqno = _rfc5444_get_u16(&ptr, eob, &result);
  }

  if (result != RFC5444_OKAY) {
    /*
     * error during parsing, do not jump to cleanup_parse packet because
     * we have not allocated any resources at this point
     */
    return result;
  }

  /* initialize avl_tree */
  avl_init(&entries, avl_comp_uint32, true);
  last_started = NULL;

  /* check for packet tlv */
  has_tlv = (context.pkt_flags & RFC5444_PKT_FLAG_TLV) != 0;
  if (has_tlv) {
    result = _parse_tlvblock(parser, &entries, &ptr, eob, 0);
    if (result != RFC5444_OKAY) {
      /*
       * error while parsing TLV block, do not jump to cleanup_parse packet because
       * we have not allocated any resources at this point
       */
      return result;
    }
  }

  /* update packet buffer pointer */
  context.pkt_buffer = buffer;
  context.pkt_size = length;

  /* handle packet consumers, call start callbacks */
  avl_for_each_element(&parser->packet_consumer, consumer, _node) {
    last_started = consumer;
    /* this one can drop a packet */
    if (consumer->start_callback != NULL) {
      context.consumer = consumer;
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      result =
#endif
        consumer->start_callback(&context);
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      if (result != RFC5444_OKAY) {
        goto cleanup_parse_packet;
      }
#endif
    }
    /* handle packet tlv consumers */
    if (has_tlv && (consumer->tlv_callback != NULL || consumer->block_callback != NULL)) {
      /* can drop packet */
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      result =
#endif
        _schedule_tlvblock(consumer, &context, &entries, 0);
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      if (result != RFC5444_OKAY) {
        goto cleanup_parse_packet;
      }
#endif
    }
  }

  /* parse messages */
  while (result == RFC5444_OKAY && ptr < eob) {
    /* can drop packet (need to be there for error handling too) */
    result = _handle_message(parser, &context, &ptr, eob);
  }

#if DISALLOW_CONSUMER_CONTEXT_DROP == false
cleanup_parse_packet:
#endif
  /* call end-of-context callback */
  if (!avl_is_empty(&parser->packet_consumer)) {
    avl_for_first_to_element_reverse(&parser->packet_consumer, last_started, consumer, _node) {
      if (consumer->end_callback) {
        context.consumer = consumer;
        consumer->end_callback(&context, result != RFC5444_OKAY);
      }
    }
  }
  _free_tlvblock(parser, &entries);

  /* do not tell caller about packet drop */
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
  if (result == RFC5444_DROP_PACKET) {
    return RFC5444_OKAY;
  }
#endif
  return result;
}